

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  int i;
  ImGuiTable *pIVar1;
  int idx;
  ImPool<ImGuiTable> *this_local;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiTable>::resize(&this->Buf,(this->Buf).Size + 1);
    this->FreeIdx = this->FreeIdx + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTable>::operator[](&this->Buf,i);
    this->FreeIdx = pIVar1->ID;
  }
  ImVector<ImGuiTable>::operator[](&this->Buf,i);
  pIVar1 = (ImGuiTable *)operator_new(0x218);
  ImGuiTable::ImGuiTable(pIVar1);
  this->AliveCount = this->AliveCount + 1;
  pIVar1 = ImVector<ImGuiTable>::operator[](&this->Buf,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }